

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O0

void __thiscall Progress::done(Progress *this)

{
  _Setfill<char> _Var1;
  int iVar2;
  _Setw _Var3;
  ostream *poVar4;
  Progress *this_local;
  
  iVar2 = fileno(_stdout);
  iVar2 = isatty(iVar2);
  if (iVar2 != 0) {
    if ((this->remove & 1U) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"\r");
      _Var1 = std::setfill<char>(' ');
      poVar4 = std::operator<<(poVar4,_Var1._M_c);
      _Var3 = std::setw(this->width);
      poVar4 = std::operator<<(poVar4,_Var3);
      std::operator<<(poVar4,' ');
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Progress::done ()
{
  if (isatty (fileno (stdout)))
  {
    if (remove)
      std::cout << "\r"
                << std::setfill (' ')
                << std::setw (width)
                << ' ';

    std::cout << std::endl;
  }
}